

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  uint uVar1;
  int iVar2;
  Instruction *pIVar3;
  
  pIVar3 = fs->f->code;
  iVar2 = (e->u).info;
  uVar1 = nresults * 0x1000000 + 0x1000000 + (pIVar3[iVar2] & 0xffffff);
  if (e->k == VCALL) {
    pIVar3[iVar2] = uVar1;
  }
  else {
    pIVar3[iVar2] = (uint)fs->freereg << 7 | uVar1 & 0xffff807f;
    luaK_checkstack(fs,1);
    fs->freereg = fs->freereg + '\x01';
  }
  return;
}

Assistant:

void luaK_setreturns (FuncState *fs, expdesc *e, int nresults) {
  Instruction *pc = &getinstruction(fs, e);
  if (e->k == VCALL)  /* expression is an open function call? */
    SETARG_C(*pc, nresults + 1);
  else {
    lua_assert(e->k == VVARARG);
    SETARG_C(*pc, nresults + 1);
    SETARG_A(*pc, fs->freereg);
    luaK_reserveregs(fs, 1);
  }
}